

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationaryQPlanner.cpp
# Opt level: O2

void __thiscall PerseusNonStationaryQPlanner::PlanAll(PerseusNonStationaryQPlanner *this)

{
  int iVar1;
  _func_int *p_Var2;
  const_reference pvVar3;
  long lVar4;
  reference pvVar5;
  JointBeliefInterface *pJVar6;
  ostream *poVar7;
  uint iter;
  ulong __n;
  PlanningUnitMADPDiscrete *this_00;
  int iVar8;
  bool bVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete Qt1;
  QFunctionsDiscrete Qt;
  QFunctionsDiscreteNonStationary Q;
  vector<double,_std::allocator<double>_> VBnew;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_b8;
  QFunctionsDiscrete local_98;
  _Vector_base<double,_std::allocator<double>_> local_80;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  Perseus::PlanLeadIn((Perseus *)this);
  p_Var2 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                   (long)p_Var2);
  if (lVar4 == 0) {
    lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                     (long)p_Var2);
  }
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::vector(&local_60,*(size_type *)(lVar4 + 0x18),(allocator_type *)&local_80);
  local_98.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                   (long)p_Var2);
  if (lVar4 == 0) {
    lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                     (long)p_Var2);
  }
  pvVar3 = std::
           vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
           ::at(*(vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                  **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8,
                (ulong)*(uint *)(lVar4 + 0x18));
  BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_80,pvVar3,&local_98);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)&local_d8,&local_80);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
  p_Var2 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                   (long)p_Var2);
  if (lVar4 == 0) {
    lVar4 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                     (long)p_Var2);
  }
  iVar1 = *(int *)(lVar4 + 0x18);
  iVar8 = 0;
  while (iter = iVar1 + iVar8, -1 < (int)iter) {
    Perseus::
    PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              ((Perseus *)this,iter,(vector<double,_std::allocator<double>_> *)&local_d8,&local_98);
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar9) {
      Perseus::GetInitialQFunctions((QFunctionsDiscrete *)&local_80,(Perseus *)this);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::_M_move_assign(&local_98,&local_80);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)&local_80);
    }
    else {
      __n = (ulong)iter;
      pvVar3 = std::
               vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ::at(*(vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                      **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8,__n);
      (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[0xe])
                (&local_80,this,pvVar3,&local_b8);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::_M_move_assign(&local_98,&local_80);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)&local_80);
      pvVar3 = std::
               vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ::at(*(vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                      **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8,__n);
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_80,pvVar3,&local_98);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)&local_48,&local_80);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)&local_d8,
                 (vector<double,_std::allocator<double>_> *)&local_48);
      pvVar5 = std::
               vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               ::at(&local_60,__n);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator=(pvVar5,&local_98);
    }
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator=(&local_b8,&local_98);
    Perseus::PlanEndOfIteration((Perseus *)this);
  }
  (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[4])(this,&local_60);
  if ((this->super_PerseusNonStationary).super_Perseus._m_dryrun == false) {
    (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[7])
              (this,&(this->super_PerseusNonStationary).super_Perseus._m_valueFunctionFilename);
  }
  p_Var2 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             ((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose + (long)p_Var2);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue + (long)p_Var2)
    ;
  }
  pJVar6 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
  std::__cxx11::string::string
            ((string *)&local_80,
             (string *)&(this->super_PerseusNonStationary).super_Perseus._m_identification);
  poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_80);
  std::operator<<(poVar7,": final Vjb0 = ");
  lVar4 = *(long *)((long)*pJVar6 + -0xb8);
  pvVar5 = std::
           vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           ::at(&local_60,0);
  dVar10 = BeliefValue::GetValue((BeliefInterface *)(&pJVar6->field_0x0 + lVar4),pvVar5);
  poVar7 = std::ostream::_M_insert<double>(dVar10);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_80);
  (**(code **)((long)*pJVar6 + 8))(pJVar6);
  Perseus::PlanLeadOut((Perseus *)this);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void PerseusNonStationaryQPlanner::PlanAll()
{
    PlanLeadIn();

    QFunctionsDiscreteNonStationary Q(GetPU()->GetHorizon());
    QFunctionsDiscrete Qt,Qt1;
    // records the value of each belief in the belief set
    vector<double> VB,VBnew;
    
    VB=BeliefValue::GetValues(_m_beliefs->Get(GetPU()->GetHorizon()),Qt);

    int lastTimestep=GetPU()->GetHorizon();
    for(int t=lastTimestep;t>=0;--t)
    {
        // print out some info
        PlanStartOfIteration(t,VB,Qt);

        // the real thing: compute the next stage value function
        if(t==lastTimestep)
            Qt=GetInitialQFunctions();
        else
        {
            Qt=BackupStageAll(_m_beliefs->Get(t),Qt1);

            // compute the maximum difference in the values for all
            // beliefs: for the convergence test
            VBnew=BeliefValue::GetValues(_m_beliefs->Get(t),Qt);
            
            VB=VBnew;
            Q.at(t)=Qt;
        }

        Qt1=Qt;
        PlanEndOfIteration();
    }

    StoreValueFunction(Q);
    if(!_m_dryrun)
        ExportValueFunction(_m_valueFunctionFilename);
            
    JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
    cout << GetIdentification() << ": final Vjb0 = "
         << BeliefValue::GetValue( *jb0, Q.at(0)) <<  endl;
    delete jb0;

    PlanLeadOut();
}